

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_Player(FParser *this)

{
  int iVar1;
  AActor *pAVar2;
  
  if (this->t_argc == 0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
  }
  else {
    pAVar2 = actorvalue(this->t_argv);
  }
  (this->t_return).type = 1;
  iVar1 = -1;
  if ((pAVar2 != (AActor *)0x0) && (pAVar2->player != (player_t *)0x0)) {
    iVar1 = (int)((long)(pAVar2->player[-0x3b4b].frags + 7) / 0x2a0);
  }
  (this->t_return).value.i = iVar1;
  return;
}

Assistant:

void FParser::SF_Player(void)
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	t_return.type = svt_int;
	
	if(mo && mo->player) // haleyjd: added mo->player
	{
		t_return.value.i = (int)(mo->player - players);
	}
	else
	{
		t_return.value.i = -1;
	}
}